

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O2

void adios2::utils::print_decomp<unsigned_long>(Engine *fp,IO *io,Variable<unsigned_long> *variable)

{
  uint uVar1;
  size_t n;
  unsigned_long *puVar2;
  Dims Start;
  Dims Start_00;
  size_t *psVar3;
  undefined8 *puVar4;
  _Rb_tree_node_base *p_Var5;
  Variable<unsigned_long> *pVVar6;
  long lVar7;
  _Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *p_Var8;
  _Base_ptr p_Var9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint *puVar14;
  char *pcVar15;
  size_t k_1;
  size_t j;
  ulong uVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  size_t k;
  bool bVar20;
  undefined1 in_stack_fffffffffffffe80 [12];
  DataType adiosvartype;
  DataType DVar21;
  size_t ndim;
  _Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_168;
  Variable<unsigned_long> *local_160;
  uint local_158;
  allocator_type local_151;
  _Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_150;
  uint local_144;
  Engine *local_140;
  Variable<unsigned_long> *local_138;
  Variable<unsigned_long> *local_130;
  map<unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
  allblocks;
  _Rb_tree_node_base local_120;
  long local_100;
  ulong local_f8;
  IO *local_f0;
  Dims c;
  Dims s;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  _Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *local_98;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  adiosvartype = *(DataType *)(variable + 0x28);
  local_f0 = io;
  psVar3 = (size_t *)(**(code **)(*(long *)fp + 0x58))(fp,variable,*(long *)(variable + 0xf8) + -1);
  local_160 = variable;
  local_140 = fp;
  if (psVar3 == (size_t *)0x0) {
    adios2::core::Engine::AllStepsBlocksInfo<unsigned_long>((Variable *)&allblocks);
    if (local_100 != 0) {
      lVar13 = std::_Rb_tree_decrement(&local_120);
      iVar12 = ndigits(*(size_t *)(lVar13 + 0x20));
      local_138 = (Variable<unsigned_long> *)CONCAT44(local_138._4_4_,iVar12);
      p_Var5 = local_120._M_left;
      if ((*(int *)(variable + 0x40) == 4) || (*(int *)(variable + 0x40) == 1)) {
        for (; p_Var5 != &local_120; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5))
        {
          fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,
                  (ulong)local_138 & 0xffffffff);
          lVar13 = (long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent;
          if (lVar13 == 0x1a0) {
            fwrite(" = ",3,1,outf);
            print_data(&p_Var5[1]._M_parent[7]._M_right,0,adiosvartype,true,false);
            fputc(10,outf);
          }
          else {
            fprintf(outf,"%zu instances available\n",lVar13 / 0x1a0);
          }
          if (dump == '\x01') {
            fwrite("               ",0xf,1,outf);
            iVar12 = 0;
            lVar13 = 0xf8;
            for (uVar16 = 0;
                uVar16 < (ulong)(((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent) / 0x1a0);
                uVar16 = uVar16 + 1) {
              print_data((void *)((long)&(p_Var5[1]._M_parent)->_M_color + lVar13),0,adiosvartype,
                         true,false);
              iVar12 = iVar12 + 1;
              if (uVar16 < ((long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent) / 0x1a0 - 1U) {
                if (iVar12 < ncols) {
                  fputc(0x20,outf);
                }
                else {
                  fwrite("\n               ",0x10,1,outf);
                  iVar12 = 0;
                }
              }
              lVar13 = lVar13 + 0x1a0;
            }
            fputc(10,outf);
          }
        }
      }
      else {
        lVar13 = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
        lVar18 = 0;
        while (bVar20 = lVar13 != 0, lVar13 = lVar13 + -1, bVar20) {
          pVVar6 = variable + 0x88;
          if (*(int *)(local_160 + 0x40) == 2) {
            pVVar6 = variable + 0x58;
          }
          iVar12 = ndigits(*(long *)(*(long *)pVVar6 + lVar18 * 2) - 1);
          *(int *)((long)&ndigits_dims + lVar18) = iVar12;
          lVar18 = lVar18 + 4;
        }
        local_130 = (Variable<unsigned_long> *)0x0;
        pVVar6 = local_160;
        for (p_Var9 = local_120._M_left; p_Var9 != &local_120;
            p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
          p_Var8 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   (((long)p_Var9[1]._M_left - (long)p_Var9[1]._M_parent) / 0x1a0);
          fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,
                  (ulong)local_138 & 0xffffffff,*(undefined8 *)(p_Var9 + 1));
          fputc(10,outf);
          local_150 = p_Var8;
          local_158 = ndigits((size_t)((long)&p_Var8[-1]._M_impl.super__Vector_impl_data.
                                              _M_end_of_storage + 7));
          p_Var8 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)0x0;
          while (p_Var8 != local_150) {
            fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,(ulong)local_158);
            uVar16 = *(long *)(pVVar6 + 0x90) - *(long *)(pVVar6 + 0x88) >> 3;
            puVar14 = &ndigits_dims;
            local_168 = p_Var8;
            for (uVar19 = 0; uVar16 != uVar19; uVar19 = uVar19 + 1) {
              lVar13 = *(long *)(*(long *)(p_Var9[1]._M_parent + (long)p_Var8 * 0xd + 3) +
                                uVar19 * 8);
              if (lVar13 == 0) {
                uVar11 = (ulong)(*puVar14 * 2 + 1);
                pcVar15 = "%-*s";
                pcVar10 = "null";
LAB_0013ede1:
                fprintf(outf,pcVar15,uVar11,pcVar10);
              }
              else {
                uVar11 = (ulong)*puVar14;
                if (*(int *)(local_160 + 0x40) != 2) {
                  pcVar10 = (char *)(lVar13 + -1);
                  pcVar15 = "0:%*zu";
                  goto LAB_0013ede1;
                }
                lVar18 = *(long *)(&(p_Var9[1]._M_parent[(long)p_Var8 * 0xd + 2]._M_parent)->
                                    _M_color + uVar19 * 2);
                fprintf(outf,"%*zu:%*zu",uVar11,lVar18,(ulong)*puVar14,lVar13 + lVar18 + -1);
              }
              if (uVar19 < uVar16 - 1) {
                fwrite(", ",2,1,outf);
              }
              puVar14 = puVar14 + 1;
            }
            fputc(0x5d,outf);
            if (longopt != '\0') {
              fwrite(" = ",3,1,outf);
              DVar21 = adiosvartype;
              print_data(&p_Var9[1]._M_parent[(long)p_Var8 * 0xd + 7]._M_parent,0,adiosvartype,false
                         ,false);
              fwrite(" / ",3,1,outf);
              print_data(&p_Var9[1]._M_parent[(long)p_Var8 * 0xd + 7]._M_left,0,adiosvartype,false,
                         false);
              adiosvartype = DVar21;
            }
            fputc(10,outf);
            pVVar6 = local_160;
            if (dump == '\x01') {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         (p_Var9[1]._M_parent + (long)p_Var8 * 0xd + 3));
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &p_Var9[1]._M_parent[(long)p_Var8 * 0xd + 2]._M_parent);
              Start_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._8_12_ = in_stack_fffffffffffffe80;
              Start_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)&local_60;
              Start_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = adiosvartype;
              readVarBlock<unsigned_long>
                        (local_140,local_f0,pVVar6,(size_t)local_130,(size_t)local_168,
                         (Dims *)&local_48,Start_00);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&local_60);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&local_48);
            }
            p_Var8 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                     ((long)&(local_168->_M_impl).super__Vector_impl_data._M_start + 1);
          }
          local_130 = (Variable<unsigned_long> *)((long)local_130 + 1);
        }
      }
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<adios2::core::Variable<unsigned_long>::BPInfo,_std::allocator<adios2::core::Variable<unsigned_long>::BPInfo>_>_>_>_>
                 *)&allblocks);
  }
  else {
    n = *psVar3;
    std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::~_Vector_base
              ((_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
               (psVar3 + 4));
    operator_delete(psVar3);
    local_144 = ndigits(n);
    if ((*(int *)(variable + 0x40) == 1) || (*(int *)(variable + 0x40) == 4)) {
      for (local_168 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                       0x0; local_168 < *(ulong *)(variable + 0xf8);
          local_168 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                      ((long)local_168 + 1)) {
        puVar4 = (undefined8 *)(**(code **)(*(long *)local_140 + 0x58))(local_140,variable);
        local_150 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                    (puVar4 + 4);
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
                  ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)&allblocks
                   ,(vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)local_150
                  );
        fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_144,*puVar4);
        if (local_120._0_8_ - _allblocks == 0x50) {
          fwrite(" = ",3,1,outf);
          print_data(*(void **)(_allblocks + 0x40),0,adiosvartype,true,true);
          fputc(10,outf);
        }
        else {
          fprintf(outf,"%zu instances available\n",(local_120._0_8_ - _allblocks) / 0x50);
        }
        if (dump == '\x01') {
          fwrite("               ",0xf,1,outf);
          lVar13 = 0x40;
          iVar12 = 0;
          for (uVar16 = 0; uVar16 < (ulong)((local_120._0_8_ - _allblocks) / 0x50);
              uVar16 = uVar16 + 1) {
            print_data(*(void **)(_allblocks + lVar13),0,adiosvartype,true,true);
            iVar12 = iVar12 + 1;
            if (uVar16 < (local_120._0_8_ - _allblocks) / 0x50 - 1U) {
              if (iVar12 < ncols) {
                fputc(0x20,outf);
              }
              else {
                fwrite("\n               ",0x10,1,outf);
                iVar12 = 0;
              }
            }
            lVar13 = lVar13 + 0x50;
          }
          fputc(10,outf);
          variable = local_160;
        }
        std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
        ~_Vector_base(local_150);
        operator_delete(puVar4);
        std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
        ~_Vector_base((_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                      &allblocks);
      }
    }
    else {
      local_130 = variable + 0x88;
      local_138 = variable + 0x58;
      for (local_f8 = 0; local_f8 < *(ulong *)(variable + 0xf8); local_f8 = local_f8 + 1) {
        puVar4 = (undefined8 *)(**(code **)(*(long *)local_140 + 0x58))(local_140,variable);
        local_98 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   (puVar4 + 4);
        std::vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::vector
                  ((vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)&allblocks
                   ,(vector<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)local_98)
        ;
        ndim = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
        piVar17 = &ndigits_dims;
        for (uVar16 = 0; uVar16 < ndim; uVar16 = uVar16 + 1) {
          pVVar6 = local_130;
          if (*(int *)(local_160 + 0x40) == 2) {
            pVVar6 = local_138;
          }
          iVar12 = ndigits(*(long *)(*(long *)pVVar6 + uVar16 * 8) - 1);
          *piVar17 = iVar12;
          piVar17 = piVar17 + 1;
        }
        fprintf(outf,"%c       step %*zu: ",(ulong)(uint)(int)commentchar,(ulong)local_144,*puVar4);
        fputc(10,outf);
        local_150 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                    ((local_120._0_8_ - _allblocks) / 0x50);
        local_158 = ndigits((size_t)((long)&local_150[-1]._M_impl.super__Vector_impl_data.
                                            _M_end_of_storage + 7));
        variable = local_160;
        p_Var8 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)0x0;
        while (p_Var8 != local_150) {
          fprintf(outf,"%c         block %*zu: [",(ulong)(uint)(int)commentchar,(ulong)local_158);
          ndim = *(long *)(variable + 0x90) - *(long *)(variable + 0x88) >> 3;
          lVar13 = (long)p_Var8 * 0x50;
          puVar14 = &ndigits_dims;
          local_168 = p_Var8;
          for (uVar16 = 0; uVar16 < ndim; uVar16 = uVar16 + 1) {
            lVar18 = *(long *)(_allblocks + 0x18 + lVar13);
            if (*(char *)(puVar4 + 1) != '\x01') {
              lVar18 = *(long *)(lVar18 + uVar16 * 8);
            }
            if (lVar18 == 0) {
              uVar1 = *puVar14 * 2 + 1;
              pcVar15 = "%-*s";
              pcVar10 = "null";
LAB_0013e8f9:
              fprintf(outf,pcVar15,(ulong)uVar1,pcVar10);
            }
            else {
              if (*(int *)(variable + 0x40) != 2) {
                uVar1 = *puVar14;
                pcVar10 = (char *)(lVar18 + -1);
                pcVar15 = "0:%*zu";
                goto LAB_0013e8f9;
              }
              lVar7 = *(long *)(_allblocks + 0x10 + lVar13);
              if (*(char *)(puVar4 + 1) == '\0') {
                lVar7 = *(long *)(lVar7 + uVar16 * 8);
              }
              fprintf(outf,"%*zu:%*zu",(ulong)*puVar14,lVar7,(ulong)*puVar14,lVar18 + lVar7 + -1);
            }
            if (uVar16 < ndim - 1) {
              fwrite(", ",2,1,outf);
            }
            puVar14 = puVar14 + 1;
          }
          fputc(0x5d,outf);
          if (longopt != '\0') {
            fwrite(" = ",3,1,outf);
            DVar21 = adiosvartype;
            print_data((void *)(_allblocks + lVar13 + 0x20),0,adiosvartype,false,false);
            fwrite(" / ",3,1,outf);
            print_data((void *)(_allblocks + lVar13 + 0x30),0,adiosvartype,false,false);
            adiosvartype = DVar21;
          }
          fputc(10,outf);
          if (dump == '\x01') {
            s.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            s.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            s.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            if (*(int *)(variable + 0x40) == 2) {
              if (*(char *)(puVar4 + 1) == '\x01') {
                local_b0 = *(undefined8 *)(_allblocks + 0x18 + lVar13);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_assign_aux<unsigned_long_const*>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&c,&local_b0,
                           local_a8);
                local_b0 = *(undefined8 *)(_allblocks + 0x10 + lVar13);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_assign_aux<unsigned_long_const*>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&s,&local_b0,
                           local_a8);
              }
              else {
                puVar2 = *(unsigned_long **)(_allblocks + 0x18 + lVar13);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                vector<unsigned_long*,void>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0,puVar2,
                           puVar2 + ndim,&local_151);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                          (&c,(vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0);
                std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                          ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0)
                ;
                puVar2 = *(unsigned_long **)(_allblocks + 0x10 + lVar13);
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                vector<unsigned_long*,void>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0,puVar2,
                           puVar2 + ndim,&local_151);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                          (&s,(vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0);
                std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                          ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0)
                ;
              }
            }
            else {
              puVar2 = *(unsigned_long **)(_allblocks + 0x18 + lVar13);
              std::vector<unsigned_long,std::allocator<unsigned_long>>::vector<unsigned_long*,void>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0,puVar2,
                         puVar2 + ndim,&local_151);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(&c);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0,0,&ndim,
                         &local_151);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                        (&s,(vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b0);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b0);
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,&c);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,&s);
            Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._8_12_ = in_stack_fffffffffffffe80;
            Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)&local_90;
            Start.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = adiosvartype;
            readVarBlock<unsigned_long>
                      (local_140,local_f0,variable,local_f8,(size_t)local_168,(Dims *)&local_78,
                       Start);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&local_90);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&local_78);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&s.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
          }
          p_Var8 = (_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                   ((long)&(local_168->_M_impl).super__Vector_impl_data._M_start + 1);
        }
        std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
        ~_Vector_base(local_98);
        operator_delete(puVar4);
        std::_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>::
        ~_Vector_base((_Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_> *)
                      &allblocks);
      }
    }
  }
  return;
}

Assistant:

void print_decomp(core::Engine *fp, core::IO *io, core::Variable<T> *variable)
{
    /* Print block info */
    DataType adiosvartype = variable->m_Type;

    MinVarInfo *mBI = nullptr;
    mBI = fp->MinBlocksInfo(*variable, variable->m_AvailableStepsCount - 1 /* relative step 0 */);

    // first step
    if (mBI)
    {
        size_t laststep = mBI->Step; // used relative last step above
        delete mBI;
        int ndigits_nsteps = ndigits(laststep);
        if (variable->m_ShapeID == ShapeID::GlobalValue ||
            variable->m_ShapeID == ShapeID::LocalValue)
        {
            for (size_t RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                auto minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                auto blocks = minBlocksInfo->BlocksInfo;
                fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps,
                        minBlocksInfo->Step);
                if (blocks.size() == 1)
                {
                    fprintf(outf, " = ");
                    print_data(blocks[0].BufferP, 0, adiosvartype, true, /* MBI */ true);
                    fprintf(outf, "\n");
                }
                else
                {
                    fprintf(outf, "%zu instances available\n", blocks.size());
                }
                if (dump)
                {
                    fprintf(outf, "               ");
                    int col = 0;
                    for (size_t j = 0; j < blocks.size(); j++)
                    {
                        print_data(blocks[j].BufferP, 0, adiosvartype, true, /* MBI */ true);
                        ++col;
                        if (j < blocks.size() - 1)
                        {
                            if (col < ncols)
                            {
                                fprintf(outf, " ");
                            }
                            else
                            {
                                fprintf(outf, "\n               ");
                                col = 0;
                            }
                        }
                    }
                    fprintf(outf, "\n");
                }
                delete minBlocksInfo;
            }
        }
        else
        {
            // arrays
            for (size_t RelStep = 0; RelStep < variable->m_AvailableStepsCount; RelStep++)
            {
                auto minBlocksInfo = fp->MinBlocksInfo(*variable, RelStep);
                auto blocks = minBlocksInfo->BlocksInfo;
                size_t ndim = variable->m_Count.size();
                int ndigits_nblocks;
                for (size_t k = 0; k < ndim; k++)
                {
                    // get digit lengths for each dimension
                    if (variable->m_ShapeID == ShapeID::GlobalArray)
                    {
                        ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
                    }
                    else
                    {
                        ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
                    }
                }

                size_t stepAbsolute = minBlocksInfo->Step;

                fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, stepAbsolute);
                fprintf(outf, "\n");
                const size_t blocksSize = blocks.size();
                ndigits_nblocks = ndigits(blocksSize - 1);

                for (size_t j = 0; j < blocksSize; j++)
                {
                    fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

                    // just in case ndim for a block changes in LocalArrays:
                    ndim = variable->m_Count.size();

                    for (size_t k = 0; k < ndim; k++)
                    {
                        size_t c = (minBlocksInfo->WasLocalValue
                                        ? reinterpret_cast<size_t>(blocks[j].Count)
                                        : blocks[j].Count[k]);

                        if (c)
                        {
                            if (variable->m_ShapeID == ShapeID::GlobalArray)
                            {
                                size_t s = (minBlocksInfo->WasLocalValue
                                                ? reinterpret_cast<size_t>(blocks[j].Start)
                                                : blocks[j].Start[k]);
                                fprintf(outf, "%*zu:%*zu", ndigits_dims[k], s, ndigits_dims[k],
                                        s + c - 1);
                            }
                            else
                            {
                                // blockStart is empty vector for LocalArrays
                                fprintf(outf, "0:%*zu", ndigits_dims[k], c - 1);
                            }
                        }
                        else
                        {
                            fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                        }
                        if (k < ndim - 1)
                            fprintf(outf, ", ");
                    }
                    fprintf(outf, "]");

                    /* Print per-block statistics if available */
                    if (longopt)
                    {
                        if (true /* TODO: variable->has_minmax */)
                        {
                            fprintf(outf, " = ");
                            print_data(&blocks[j].MinMax.MinUnion, 0, adiosvartype, false);

                            fprintf(outf, " / ");
                            print_data(&blocks[j].MinMax.MaxUnion, 0, adiosvartype, false);
                        }
                        else
                        {
                            fprintf(outf, "N/A / N/A");
                        }
                    }
                    fprintf(outf, "\n");
                    if (dump)
                    {
                        Dims s, c;
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            if (minBlocksInfo->WasLocalValue)
                            {
                                c = {reinterpret_cast<size_t>(blocks[j].Count)};
                                s = {reinterpret_cast<size_t>(blocks[j].Start)};
                            }
                            else
                            {
                                c = Dims(blocks[j].Count, blocks[j].Count + ndim);
                                s = Dims(blocks[j].Start, blocks[j].Start + ndim);
                            }
                        }
                        else
                        {
                            c = Dims(blocks[j].Count, blocks[j].Count + ndim);
                            s = Dims(0, ndim);
                        }
                        readVarBlock(fp, io, variable, RelStep, j, c, s);
                    }
                }
                delete minBlocksInfo;
            }
        }
        return;
    }

    std::map<size_t, std::vector<typename core::Variable<T>::BPInfo>> allblocks =
        fp->AllStepsBlocksInfo(*variable);
    if (allblocks.empty())
    {
        return;
    }
    size_t laststep = allblocks.rbegin()->first;
    int ndigits_nsteps = ndigits(laststep);
    if (variable->m_ShapeID == ShapeID::GlobalValue || variable->m_ShapeID == ShapeID::LocalValue)
    {
        // scalars
        for (auto &blockpair : allblocks)
        {
            size_t step = blockpair.first;
            std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
            fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, step);
            if (blocks.size() == 1)
            {
                fprintf(outf, " = ");
                print_data(&blocks[0].Value, 0, adiosvartype, true);
                fprintf(outf, "\n");
            }
            else
            {
                fprintf(outf, "%zu instances available\n", blocks.size());
            }
            if (dump)
            {
                fprintf(outf, "               ");
                int col = 0;
                for (size_t j = 0; j < blocks.size(); j++)
                {
                    print_data(&blocks[j].Value, 0, adiosvartype, true);
                    ++col;
                    if (j < blocks.size() - 1)
                    {
                        if (col < ncols)
                        {
                            fprintf(outf, " ");
                        }
                        else
                        {
                            fprintf(outf, "\n               ");
                            col = 0;
                        }
                    }
                }
                fprintf(outf, "\n");
            }
        }
        return;
    }
    else
    {
        // arrays
        size_t ndim = variable->m_Count.size();
        int ndigits_nblocks;
        for (size_t k = 0; k < ndim; k++)
        {
            // get digit lengths for each dimension
            if (variable->m_ShapeID == ShapeID::GlobalArray)
            {
                ndigits_dims[k] = ndigits(variable->m_Shape[k] - 1);
            }
            else
            {
                ndigits_dims[k] = ndigits(variable->m_Count[k] - 1);
            }
        }

        size_t stepRelative = 0;
        for (auto &blockpair : allblocks)
        {
            size_t stepAbsolute = blockpair.first;
            std::vector<typename adios2::core::Variable<T>::BPInfo> &blocks = blockpair.second;
            const size_t blocksSize = blocks.size();
            fprintf(outf, "%c       step %*zu: ", commentchar, ndigits_nsteps, stepAbsolute);
            fprintf(outf, "\n");
            ndigits_nblocks = ndigits(blocksSize - 1);

            for (size_t j = 0; j < blocksSize; j++)
            {
                fprintf(outf, "%c         block %*zu: [", commentchar, ndigits_nblocks, j);

                // just in case ndim for a block changes in LocalArrays:
                ndim = variable->m_Count.size();

                for (size_t k = 0; k < ndim; k++)
                {
                    if (blocks[j].Count[k])
                    {
                        if (variable->m_ShapeID == ShapeID::GlobalArray)
                        {
                            fprintf(outf, "%*zu:%*zu", ndigits_dims[k], blocks[j].Start[k],
                                    ndigits_dims[k], blocks[j].Start[k] + blocks[j].Count[k] - 1);
                        }
                        else
                        {
                            // blockStart is empty vector for LocalArrays
                            fprintf(outf, "0:%*zu", ndigits_dims[k], blocks[j].Count[k] - 1);
                        }
                    }
                    else
                    {
                        fprintf(outf, "%-*s", 2 * ndigits_dims[k] + 1, "null");
                    }
                    if (k < ndim - 1)
                        fprintf(outf, ", ");
                }
                fprintf(outf, "]");

                /* Print per-block statistics if available */
                if (longopt)
                {
                    if (true /* TODO: variable->has_minmax */)
                    {
                        fprintf(outf, " = ");
                        print_data(&blocks[j].Min, 0, adiosvartype, false);

                        fprintf(outf, " / ");
                        print_data(&blocks[j].Max, 0, adiosvartype, false);
                    }
                    else
                    {
                        fprintf(outf, "N/A / N/A");
                    }
                }
                fprintf(outf, "\n");
                if (dump)
                {
                    readVarBlock(fp, io, variable, stepRelative, j, blocks[j].Count,
                                 blocks[j].Start);
                }
            }
            ++stepRelative;
        }
    }
}